

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
TransformPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_kj::_::IdentityFunc<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:5221:24)>
::getImpl(TransformPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_kj::_::IdentityFunc<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:5221:24)>
          *this,ExceptionOrValue *output)

{
  undefined8 uVar1;
  char (*params) [17];
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> depResult;
  String local_588;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> local_570;
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> local_548;
  ExceptionOrValue local_380;
  char local_1e8;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> local_1e0;
  undefined1 local_1b8 [40];
  char *local_190;
  size_t sStack_188;
  ArrayDisposer *local_180;
  Disposer *pDStack_178;
  Context *local_170;
  char *pcStack_168;
  size_t local_160;
  ArrayDisposer *pAStack_158;
  undefined1 local_150 [264];
  Detail *local_48;
  RemoveConst<kj::Exception::Detail> *pRStack_40;
  Detail *local_38;
  ArrayDisposer *pAStack_30;
  
  local_380.exception.ptr.isSet = false;
  local_1e8 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_380);
  uVar1 = local_380.exception.ptr.field_1.value.context.ptr.ptr;
  if (local_380.exception.ptr.isSet == true) {
    local_1b8._0_8_ = local_380.exception.ptr.field_1.value.ownFile.content.ptr;
    local_1b8._8_8_ = local_380.exception.ptr.field_1.value.ownFile.content.size_;
    local_1b8._16_8_ = local_380.exception.ptr.field_1.value.ownFile.content.disposer;
    local_380.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_380.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_1b8._24_8_ = local_380.exception.ptr.field_1.value.file;
    local_1b8._32_8_ = local_380.exception.ptr.field_1._32_8_;
    local_190 = local_380.exception.ptr.field_1.value.description.content.ptr;
    sStack_188 = local_380.exception.ptr.field_1.value.description.content.size_;
    local_380.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_380.exception.ptr.field_1.value.description.content.size_ = 0;
    local_180 = local_380.exception.ptr.field_1.value.description.content.disposer;
    pDStack_178 = local_380.exception.ptr.field_1.value.context.ptr.disposer;
    local_380.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_170 = (Context *)uVar1;
    pcStack_168 = local_380.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_160 = local_380.exception.ptr.field_1.value.remoteTrace.content.size_;
    pAStack_158 = local_380.exception.ptr.field_1.value.remoteTrace.content.disposer;
    local_380.exception.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_380.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy(local_150,(void *)((long)&local_380.exception.ptr.field_1 + 0x68),0x105);
    local_48 = local_380.exception.ptr.field_1.value.details.builder.ptr;
    pRStack_40 = local_380.exception.ptr.field_1.value.details.builder.pos;
    local_38 = local_380.exception.ptr.field_1.value.details.builder.endPtr;
    pAStack_30 = local_380.exception.ptr.field_1.value.details.builder.disposer;
    local_380.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_380.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    local_380.exception.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    str<char_const(&)[17]>(&local_588,(kj *)"irrelevant value",params);
    local_570.tag = 1;
    local_570.field_1._0_8_ = local_588.content.ptr;
    local_570.field_1._8_8_ = local_588.content.size_;
    local_570.field_1._16_8_ = local_588.content.disposer;
    Exception::~Exception((Exception *)local_1b8);
    ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::ExceptionOr
              (&local_548,&local_570);
    ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::operator=
              ((ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
                *)output,&local_548);
    if (local_548.value.ptr.isSet == true) {
      OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::destroy
                (&local_548.value.ptr.field_1.value);
    }
    if (local_548.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_548.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::destroy(&local_570);
  }
  else if (local_1e8 == '\x01') {
    OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::moveFrom
              ((OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)local_1b8,
               &local_1e0);
    ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::ExceptionOr
              (&local_548,
               (OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)local_1b8);
    ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::operator=
              ((ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
                *)output,&local_548);
    if (local_548.value.ptr.isSet == true) {
      OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::destroy
                (&local_548.value.ptr.field_1.value);
    }
    if (local_548.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_548.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::destroy
              ((OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)local_1b8);
  }
  if (local_1e8 == '\x01') {
    OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::destroy(&local_1e0);
  }
  if (local_380.exception.ptr.isSet == true) {
    Exception::~Exception(&local_380.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    // Derive return type from DepT to reduce templating.
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = handle<T>(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(depException)));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }